

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5BufferSize(int *pRc,Fts5Buffer *pBuf,u32 nByte)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  u8 *puVar4;
  uint uVar5;
  ulong nBytes;
  
  uVar1 = pBuf->nSpace;
  iVar3 = 0;
  if (uVar1 < nByte) {
    uVar5 = 0x40;
    if (uVar1 != 0) {
      uVar5 = uVar1;
    }
    uVar2 = (long)(int)uVar5;
    do {
      nBytes = uVar2;
      uVar2 = nBytes * 2;
    } while (nBytes < nByte);
    puVar4 = pBuf->p;
    iVar3 = sqlite3_initialize();
    if ((iVar3 == 0) && (puVar4 = (u8 *)sqlite3Realloc(puVar4,nBytes), puVar4 != (u8 *)0x0)) {
      pBuf->nSpace = (int)nBytes;
      pBuf->p = puVar4;
      return 0;
    }
    *pRc = 7;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int sqlite3Fts5BufferSize(int *pRc, Fts5Buffer *pBuf, u32 nByte){
  if( (u32)pBuf->nSpace<nByte ){
    u64 nNew = pBuf->nSpace ? pBuf->nSpace : 64;
    u8 *pNew;
    while( nNew<nByte ){
      nNew = nNew * 2;
    }
    pNew = sqlite3_realloc64(pBuf->p, nNew);
    if( pNew==0 ){
      *pRc = SQLITE_NOMEM;
      return 1;
    }else{
      pBuf->nSpace = (int)nNew;
      pBuf->p = pNew;
    }
  }
  return 0;
}